

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

void lzma_mf_bt2_skip(lzma_mf *mf,uint32_t amount)

{
  uint32_t cur_match_00;
  uint32_t pos_00;
  ushort *cur_00;
  uint32_t cur_match;
  uint32_t hash_value;
  uint32_t pos;
  uint8_t *cur;
  uint32_t len_limit;
  uint32_t amount_local;
  lzma_mf *mf_local;
  
  cur._4_4_ = amount;
  do {
    cur._0_4_ = mf_avail(mf);
    if ((uint32_t)cur < mf->nice_len) {
      if ((1 < (uint32_t)cur) && (mf->action != LZMA_SYNC_FLUSH)) goto LAB_001ff2fe;
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x25c,"void lzma_mf_bt2_skip(lzma_mf *, uint32_t)");
      }
      move_pending(mf);
    }
    else {
      cur._0_4_ = mf->nice_len;
LAB_001ff2fe:
      cur_00 = (ushort *)mf_ptr(mf);
      pos_00 = mf->read_pos + mf->offset;
      cur_match_00 = mf->hash[(uint)*cur_00];
      mf->hash[(uint)*cur_00] = pos_00;
      bt_skip_func((uint32_t)cur,pos_00,(uint8_t *)cur_00,cur_match_00,mf->depth,mf->son,
                   mf->cyclic_pos,mf->cyclic_size);
      move_pos(mf);
    }
    cur._4_4_ = cur._4_4_ - 1;
    if (cur._4_4_ == 0) {
      return;
    }
  } while( true );
}

Assistant:

extern void
lzma_mf_bt2_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		header_skip(true, 2);

		hash_2_calc();

		const uint32_t cur_match = mf->hash[hash_value];
		mf->hash[hash_value] = pos;

		bt_skip();

	} while (--amount != 0);
}